

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void __thiscall
ImGuiInputTextCallbackData::InsertChars
          (ImGuiInputTextCallbackData *this,int pos,char *new_text,char *new_text_end)

{
  uint uVar1;
  ImGuiID IVar2;
  char *__src;
  ImGuiContext *pIVar3;
  size_t sVar4;
  char *__dest;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  uVar1 = this->Flags;
  if (new_text_end == (char *)0x0) {
    sVar4 = strlen(new_text);
    iVar8 = (int)sVar4;
  }
  else {
    iVar8 = (int)new_text_end - (int)new_text;
  }
  pIVar3 = GImGui;
  iVar7 = this->BufTextLen;
  if (this->BufSize <= iVar7 + iVar8) {
    if ((uVar1 >> 0x12 & 1) == 0) {
      return;
    }
    IVar2 = (GImGui->InputTextState).ID;
    if ((IVar2 == 0) || (GImGui->ActiveId != IVar2)) {
      __assert_fail("edit_state->ID != 0 && g.ActiveId == edit_state->ID",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                    ,0xe89,
                    "void ImGuiInputTextCallbackData::InsertChars(int, const char *, const char *)")
      ;
    }
    if (this->Buf != (GImGui->InputTextState).TextA.Data) {
      __assert_fail("Buf == edit_state->TextA.Data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                    ,0xe8a,
                    "void ImGuiInputTextCallbackData::InsertChars(int, const char *, const char *)")
      ;
    }
    iVar5 = 0x100;
    if (0x100 < iVar8) {
      iVar5 = iVar8;
    }
    if (iVar8 * 4 < iVar5) {
      iVar5 = iVar8 * 4;
    }
    iVar6 = 0x20;
    if (7 < iVar8) {
      iVar6 = iVar5;
    }
    iVar5 = iVar6 + iVar7 + 1;
    iVar7 = iVar6 + iVar7 + 2;
    if ((GImGui->InputTextState).TextA.Capacity < iVar7) {
      __dest = (char *)ImGui::MemAlloc((long)iVar7);
      __src = (pIVar3->InputTextState).TextA.Data;
      if (__src != (char *)0x0) {
        memcpy(__dest,__src,(long)(pIVar3->InputTextState).TextA.Size);
        ImGui::MemFree((pIVar3->InputTextState).TextA.Data);
      }
      (pIVar3->InputTextState).TextA.Data = __dest;
      (pIVar3->InputTextState).TextA.Capacity = iVar7;
    }
    this->Buf = (pIVar3->InputTextState).TextA.Data;
    (pIVar3->InputTextState).BufCapacityA = iVar5;
    this->BufSize = iVar5;
  }
  iVar7 = this->BufTextLen - pos;
  if (iVar7 != 0) {
    memmove(this->Buf + pos + iVar8,this->Buf + pos,(long)iVar7);
  }
  memcpy(this->Buf + pos,new_text,(long)iVar8);
  this->Buf[(long)iVar8 + (long)this->BufTextLen] = '\0';
  if (pos <= this->CursorPos) {
    this->CursorPos = this->CursorPos + iVar8;
  }
  this->SelectionEnd = this->CursorPos;
  this->SelectionStart = this->CursorPos;
  this->BufDirty = true;
  this->BufTextLen = this->BufTextLen + iVar8;
  return;
}

Assistant:

void ImGuiInputTextCallbackData::InsertChars(int pos, const char* new_text, const char* new_text_end)
{
    const bool is_resizable = (Flags & ImGuiInputTextFlags_CallbackResize) != 0;
    const int new_text_len = new_text_end ? (int)(new_text_end - new_text) : (int)strlen(new_text);
    if (new_text_len + BufTextLen >= BufSize)
    {
        if (!is_resizable)
            return;

        // Contrary to STB_TEXTEDIT_INSERTCHARS() this is working in the UTF8 buffer, hence the mildly similar code (until we remove the U16 buffer altogether!)
        ImGuiContext& g = *GImGui;
        ImGuiInputTextState* edit_state = &g.InputTextState;
        IM_ASSERT(edit_state->ID != 0 && g.ActiveId == edit_state->ID);
        IM_ASSERT(Buf == edit_state->TextA.Data);
        int new_buf_size = BufTextLen + ImClamp(new_text_len * 4, 32, ImMax(256, new_text_len)) + 1;
        edit_state->TextA.reserve(new_buf_size + 1);
        Buf = edit_state->TextA.Data;
        BufSize = edit_state->BufCapacityA = new_buf_size;
    }

    if (BufTextLen != pos)
        memmove(Buf + pos + new_text_len, Buf + pos, (size_t)(BufTextLen - pos));
    memcpy(Buf + pos, new_text, (size_t)new_text_len * sizeof(char));
    Buf[BufTextLen + new_text_len] = '\0';

    if (CursorPos >= pos)
        CursorPos += new_text_len;
    SelectionStart = SelectionEnd = CursorPos;
    BufDirty = true;
    BufTextLen += new_text_len;
}